

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AeronArchive.cpp
# Opt level: O0

int64_t __thiscall
aeron::archive::AeronArchive::callAndPollForDescriptors
          (AeronArchive *this,function<bool_(long)> *f,int32_t recordCount,
          RecordingDescriptorConsumer *consumer,char *request)

{
  undefined8 uVar1;
  bool bVar2;
  element_type *this_00;
  ArchiveException *this_01;
  char *pcVar3;
  int64_t iVar4;
  allocator local_e9;
  string local_e8;
  allocator local_c1;
  string local_c0;
  allocator local_99;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  int64_t local_48;
  int64_t correlationId;
  unique_lock<std::mutex> lock;
  char *request_local;
  RecordingDescriptorConsumer *consumer_local;
  int32_t recordCount_local;
  function<bool_(long)> *f_local;
  AeronArchive *this_local;
  
  lock._8_8_ = request;
  std::unique_lock<std::mutex>::unique_lock((unique_lock<std::mutex> *)&correlationId,&this->lock_);
  this_00 = std::__shared_ptr_access<aeron::Aeron,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
            operator->((__shared_ptr_access<aeron::Aeron,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                        *)&this->aeron_);
  local_48 = Aeron::nextCorrelationId(this_00);
  bVar2 = std::function<bool_(long)>::operator()(f,local_48);
  if (!bVar2) {
    this_01 = (ArchiveException *)__cxa_allocate_exception(0x48);
    uVar1 = lock._8_8_;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_98,(char *)uVar1,&local_99);
    std::operator+(&local_78,&local_98,": failed to send");
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)&local_c0,
               "std::int64_t aeron::archive::AeronArchive::callAndPollForDescriptors(std::function<bool (std::int64_t)> &&, std::int32_t, RecordingDescriptorConsumer &&, const char *)"
               ,&local_c1);
    pcVar3 = aeron::util::past_prefix
                       ("/workspace/llm4binary/github/license_all_cmakelists_1510/fairtide[P]aeron-archive-client"
                        ,
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/fairtide[P]aeron-archive-client/src/AeronArchive.cpp"
                       );
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_e8,pcVar3,&local_e9);
    ArchiveException::ArchiveException(this_01,&local_78,&local_c0,&local_e8,0x1ce);
    __cxa_throw(this_01,&ArchiveException::typeinfo,ArchiveException::~ArchiveException);
  }
  iVar4 = pollForDescriptors(this,local_48,recordCount,consumer);
  std::unique_lock<std::mutex>::~unique_lock((unique_lock<std::mutex> *)&correlationId);
  return iVar4;
}

Assistant:

std::int64_t AeronArchive::callAndPollForDescriptors(std::function<bool(std::int64_t)>&& f, std::int32_t recordCount,
                                                     RecordingDescriptorConsumer&& consumer, const char* request) {
    std::unique_lock<std::mutex> lock(lock_);

    std::int64_t correlationId = aeron_->nextCorrelationId();

    if (!f(correlationId)) {
        throw ArchiveException(std::string(request) + ": failed to send", SOURCEINFO);
    }

    return pollForDescriptors(correlationId, recordCount, std::move(consumer));
}